

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void CoreML::Specification::Metadata::
     SerializeWithCachedSizes(google::protobuf::io::CodedOutputStream*)::string_>_const__
               (ConstPtr p)

{
  google::protobuf::internal::WireFormatLite::VerifyUtf8String
            ((p->first)._M_dataplus._M_p,(int)(p->first)._M_string_length,SERIALIZE,
             "CoreML.Specification.Metadata.UserDefinedEntry.key");
  google::protobuf::internal::WireFormatLite::VerifyUtf8String
            ((p->second)._M_dataplus._M_p,(int)(p->second)._M_string_length,SERIALIZE,
             "CoreML.Specification.Metadata.UserDefinedEntry.value");
  return;
}

Assistant:

static void Check(ConstPtr p) {
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          p->first.data(), p->first.length(),
          ::google::protobuf::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.Metadata.UserDefinedEntry.key");
        ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
          p->second.data(), p->second.length(),
          ::google::protobuf::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.Metadata.UserDefinedEntry.value");
      }